

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_coboundary_of_a_cell
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Bitmap_cubical_complex_base<double> *this,size_t cell)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counter;
  ulong local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  compute_counter_for_given_cell
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,this,cell);
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar4 = cell;
  for (uVar5 = (long)(this->multipliers).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->multipliers).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2; 1 < uVar5; uVar5 = uVar5 - 1) {
    uVar3 = CONCAT44(0,(this->multipliers).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar5 - 1]);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar4;
    sVar4 = sVar4 % uVar3;
    if ((auVar2 / auVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if ((uVar3 <= cell && cell - uVar3 != 0) &&
         (local_48._M_impl.super__Vector_impl_data._M_start[uVar5 - 1] != 0)) {
        local_50 = cell - uVar3;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (__return_storage_ptr__,&local_50);
        uVar3 = (ulong)(this->multipliers).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar5 - 1];
      }
      if ((uVar3 + cell <
           (ulong)((long)(this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3)) &&
         (local_48._M_impl.super__Vector_impl_data._M_start[uVar5 - 1] !=
          (this->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5 - 1] * 2)) {
        local_50 = uVar3 + cell;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (__return_storage_ptr__,&local_50);
      }
    }
  }
  if ((sVar4 & 1) == 0) {
    if ((1 < cell) && (*local_48._M_impl.super__Vector_impl_data._M_start != 0)) {
      local_50 = cell - 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (__return_storage_ptr__,&local_50);
    }
    if ((cell + 1 <
         (ulong)((long)(this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3)) &&
       (*local_48._M_impl.super__Vector_impl_data._M_start !=
        *(this->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start * 2)) {
      local_50 = cell + 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (__return_storage_ptr__,&local_50);
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::size_t> Bitmap_cubical_complex_base<T>::get_coboundary_of_a_cell(std::size_t cell) const {
  std::vector<unsigned> counter = this->compute_counter_for_given_cell(cell);
  std::vector<std::size_t> coboundary_elements;
  std::size_t cell1 = cell;
  for (std::size_t i = this->multipliers.size(); i > 1; --i) {
    // It is a bit sad to recompute those divisions when we just did them in compute_counter_for_given_cell.
    unsigned position = cell1 / this->multipliers[i - 1];
    cell1 = cell1 % this->multipliers[i - 1];
    if (position % 2 == 0) {
      if ((cell > this->multipliers[i - 1]) && (counter[i - 1] != 0)) {
        coboundary_elements.push_back(cell - this->multipliers[i - 1]);
      }
      if ((cell + this->multipliers[i - 1] < this->data.size()) && (counter[i - 1] != 2 * this->sizes[i - 1])) {
        coboundary_elements.push_back(cell + this->multipliers[i - 1]);
      }
    }
  }
  if (cell1 % 2 == 0) {
    if ((cell > 1) && (counter[0] != 0)) {
      coboundary_elements.push_back(cell - 1);
    }
    if ((cell + 1 < this->data.size()) && (counter[0] != 2 * this->sizes[0])) {
      coboundary_elements.push_back(cell + 1);
    }
  }
  return coboundary_elements;
}